

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::
RegisterTests(ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge> *this)

{
  bool bVar1;
  undefined1 condition;
  undefined1 uVar2;
  int iVar3;
  pointer pIVar4;
  ulong uVar5;
  element_type *peVar6;
  tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>
  *factory;
  ostream *poVar7;
  size_type sVar8;
  void *this_00;
  char *filename;
  tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>
  *ptVar9;
  undefined4 extraout_var;
  long *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar10;
  bool in_stack_000000f7;
  CodeLocation *in_stack_000000f8;
  string *in_stack_00000100;
  string param_name;
  Message test_name_stream;
  iterator param_it;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  size_t i;
  string test_suite_name;
  int line;
  char *file;
  ParamNameGeneratorFunc *name_func;
  ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>
  generator;
  string *instantiation_name;
  iterator gen_it;
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>
  test_info;
  iterator test_it;
  bool generated_instantiations;
  CodeLocation *in_stack_fffffffffffffc88;
  CodeLocation *in_stack_fffffffffffffc90;
  string *in_stack_fffffffffffffc98;
  TestParamInfo<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>
  *in_stack_fffffffffffffca0;
  value_type *in_stack_fffffffffffffca8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffcb0;
  string *in_stack_fffffffffffffcb8;
  pointer in_stack_fffffffffffffcc0;
  CodeLocation *in_stack_fffffffffffffcd8;
  tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>
  *in_stack_fffffffffffffcf8;
  int line_00;
  char *in_stack_fffffffffffffd00;
  Message *in_stack_fffffffffffffd08;
  undefined7 in_stack_fffffffffffffd10;
  undefined1 in_stack_fffffffffffffd17;
  void *in_stack_fffffffffffffd68;
  CodeLocation *in_stack_fffffffffffffd70;
  ostream *in_stack_fffffffffffffd78;
  ostream *in_stack_fffffffffffffd80;
  ostream *in_stack_fffffffffffffd88;
  ostream *in_stack_fffffffffffffd90;
  undefined6 in_stack_fffffffffffffda0;
  ParamNameGeneratorFunc *tear_down_tc;
  _Head_base<2UL,_aom_rc_mode,_false> local_208;
  uint uStack_204;
  uint uStack_200;
  uint uStack_1fc;
  uint local_1f8;
  uint uStack_1f4;
  TestMode TStack_1f0;
  undefined4 uStack_1ec;
  CodecFactory *local_1e8;
  tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>
  *in_stack_fffffffffffffe38;
  string local_1b8 [32];
  string local_198 [32];
  _Base_ptr local_178;
  undefined1 local_170;
  GTestLog local_168;
  GTestLog local_164;
  TestParamInfo<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>
  local_160;
  string local_130 [3];
  long local_c8;
  string local_c0 [32];
  string local_a0 [36];
  int local_7c;
  char *local_78;
  ParamNameGeneratorFunc *local_70;
  undefined1 local_58 [16];
  pointer local_48;
  InstantiationInfo *local_40;
  __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo>_>_>
  local_38 [3];
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>
  *local_20;
  __normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>_>_>_>
  local_18;
  byte local_9;
  
  local_9 = 0;
  local_18._M_current =
       (shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>
        *)std::
          vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>_>_>
          ::begin((vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>_>_>
                   *)in_stack_fffffffffffffc88);
  while( true ) {
    local_20 = (shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>
                *)std::
                  vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>_>_>
                  ::end((vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>_>_>
                         *)in_stack_fffffffffffffc88);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>_>_>_>
                        *)in_stack_fffffffffffffc90,
                       (__normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>_>_>_>
                        *)in_stack_fffffffffffffc88);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>_>_>_>
    ::operator*(&local_18);
    std::
    shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>
    ::shared_ptr((shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>
                  *)in_stack_fffffffffffffc90,
                 (shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>
                  *)in_stack_fffffffffffffc88);
    local_38[0]._M_current =
         (InstantiationInfo *)
         std::
         vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo>_>
         ::begin((vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo>_>
                  *)in_stack_fffffffffffffc88);
    while( true ) {
      local_40 = (InstantiationInfo *)
                 std::
                 vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo>_>
                 ::end((vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo>_>
                        *)in_stack_fffffffffffffc88);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo>_>_>
                          *)in_stack_fffffffffffffc90,
                         (__normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo>_>_>
                          *)in_stack_fffffffffffffc88);
      if (!bVar1) break;
      local_48 = __gnu_cxx::
                 __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo>_>_>
                 ::operator->(local_38);
      pIVar4 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo>_>_>
               ::operator->(local_38);
      (*pIVar4->generator)(local_58);
      pIVar4 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo>_>_>
               ::operator->(local_38);
      local_70 = pIVar4->name_func;
      pIVar4 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo>_>_>
               ::operator->(local_38);
      local_78 = pIVar4->file;
      pIVar4 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo>_>_>
               ::operator->(local_38);
      local_7c = pIVar4->line;
      std::__cxx11::string::string(local_a0);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        std::operator+(in_stack_fffffffffffffcb8,(char *)in_stack_fffffffffffffcb0);
        std::__cxx11::string::operator=(local_a0,local_c0);
        std::__cxx11::string::~string(local_c0);
      }
      peVar6 = std::
               __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x4c0dce);
      std::__cxx11::string::operator+=(local_a0,(string *)peVar6);
      local_c8 = 0;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x4c0df9);
      ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>
      ::begin((ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>
               *)in_stack_fffffffffffffc98);
      while( true ) {
        ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>
        ::end((ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>
               *)in_stack_fffffffffffffc98);
        bVar1 = ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>
                ::operator!=((ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>
                              *)in_stack_fffffffffffffc90,
                             (ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>
                              *)in_stack_fffffffffffffc88);
        ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>
        ::~ParamIterator((ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>
                          *)0x4c0e54);
        iVar3 = (int)((ulong)in_stack_fffffffffffffcd8 >> 0x20);
        line_00 = (int)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
        if (!bVar1) break;
        local_9 = 1;
        Message::Message((Message *)in_stack_fffffffffffffcc0);
        tear_down_tc = local_70;
        factory = ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>
                  ::operator*((ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>
                               *)0x4c0efd);
        TestParamInfo<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>
        ::TestParamInfo(in_stack_fffffffffffffca0,
                        (tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>
                         *)in_stack_fffffffffffffc98,(size_t)in_stack_fffffffffffffc90);
        (*tear_down_tc)(local_130,&local_160);
        condition = IsValidParamName(in_stack_fffffffffffffc98);
        uVar2 = IsTrue((bool)condition);
        if (!(bool)uVar2) {
          GTestLog::GTestLog((GTestLog *)
                             CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                             (GTestLogSeverity)((ulong)in_stack_fffffffffffffd08 >> 0x20),
                             in_stack_fffffffffffffd00,line_00);
          poVar7 = GTestLog::GetStream(&local_164);
          poVar7 = std::operator<<(poVar7,"Condition IsValidParamName(param_name) failed. ");
          in_stack_fffffffffffffd90 = std::operator<<(poVar7,"Parameterized test name \'");
          in_stack_fffffffffffffd88 = std::operator<<(in_stack_fffffffffffffd90,(string *)local_130)
          ;
          in_stack_fffffffffffffd80 =
               std::operator<<(in_stack_fffffffffffffd88,"\' is invalid, in ");
          in_stack_fffffffffffffd78 = std::operator<<(in_stack_fffffffffffffd80,local_78);
          in_stack_fffffffffffffd70 =
               (CodeLocation *)std::operator<<(in_stack_fffffffffffffd78," line ");
          in_stack_fffffffffffffd68 =
               (void *)std::ostream::operator<<(in_stack_fffffffffffffd70,local_7c);
          std::ostream::operator<<(in_stack_fffffffffffffd68,std::endl<char,std::char_traits<char>>)
          ;
          GTestLog::~GTestLog((GTestLog *)in_stack_fffffffffffffc90);
        }
        sVar8 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
        bVar1 = IsTrue(sVar8 == 0);
        if (!bVar1) {
          GTestLog::GTestLog((GTestLog *)
                             CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                             (GTestLogSeverity)((ulong)in_stack_fffffffffffffd08 >> 0x20),
                             in_stack_fffffffffffffd00,line_00);
          poVar7 = GTestLog::GetStream(&local_168);
          poVar7 = std::operator<<(poVar7,
                                   "Condition test_param_names.count(param_name) == 0 failed. ");
          poVar7 = std::operator<<(poVar7,"Duplicate parameterized test name \'");
          poVar7 = std::operator<<(poVar7,(string *)local_130);
          poVar7 = std::operator<<(poVar7,"\', in ");
          poVar7 = std::operator<<(poVar7,local_78);
          poVar7 = std::operator<<(poVar7," line ");
          this_00 = (void *)std::ostream::operator<<(poVar7,local_7c);
          std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
          GTestLog::~GTestLog((GTestLog *)in_stack_fffffffffffffc90);
        }
        pVar10 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::insert(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
        local_178 = (_Base_ptr)pVar10.first._M_node;
        in_stack_fffffffffffffd17 = pVar10.second;
        local_170 = in_stack_fffffffffffffd17;
        std::
        __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x4c12e6);
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          std::
          __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x4c1303);
          in_stack_fffffffffffffd08 =
               Message::operator<<((Message *)in_stack_fffffffffffffc90,
                                   &in_stack_fffffffffffffc88->file);
          Message::operator<<((Message *)in_stack_fffffffffffffc90,
                              (char (*) [2])in_stack_fffffffffffffc88);
        }
        Message::operator<<((Message *)in_stack_fffffffffffffc90,&in_stack_fffffffffffffc88->file);
        in_stack_fffffffffffffd00 = (char *)std::__cxx11::string::c_str();
        Message::GetString_abi_cxx11_((Message *)in_stack_fffffffffffffc98);
        std::__cxx11::string::c_str();
        in_stack_fffffffffffffcf8 =
             ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>
             ::operator*((ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>
                          *)0x4c1398);
        PrintToString<std::tuple<libaom_test::CodecFactory_const*,(anonymous_namespace)::AltRefTestParams,aom_rc_mode>>
                  (in_stack_fffffffffffffe38);
        std::__cxx11::string::c_str();
        std::
        __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x4c13d2);
        CodeLocation::CodeLocation(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
        filename = (char *)(**(code **)(*in_RDI + 0x18))();
        in_stack_fffffffffffffc88 =
             (CodeLocation *)
             SuiteApiResolver<(anonymous_namespace)::AltRefFramePresenceTestLarge>::
             GetSetUpCaseOrSuite(filename,iVar3);
        in_stack_fffffffffffffc90 =
             (CodeLocation *)
             SuiteApiResolver<(anonymous_namespace)::AltRefFramePresenceTestLarge>::
             GetTearDownCaseOrSuite(filename,(int)((ulong)in_stack_fffffffffffffc88 >> 0x20));
        std::
        __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x4c1443);
        in_stack_fffffffffffffcc0 =
             std::
             unique_ptr<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>_>_>
             ::operator->((unique_ptr<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>_>_>
                           *)0x4c144f);
        ptVar9 = ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>
                 ::operator*((ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>
                              *)0x4c1461);
        local_1e8 = (ptVar9->
                    super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>
                    ).super__Head_base<0UL,_const_libaom_test::CodecFactory_*,_false>._M_head_impl;
        local_208._M_head_impl =
             (ptVar9->
             super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>
             ).super__Tuple_impl<1UL,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>.
             super__Tuple_impl<2UL,_aom_rc_mode>.super__Head_base<2UL,_aom_rc_mode,_false>.
             _M_head_impl;
        uStack_204 = (ptVar9->
                     super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>
                     ).super__Tuple_impl<1UL,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>.
                     super__Head_base<1UL,_(anonymous_namespace)::AltRefTestParams,_false>.
                     _M_head_impl.min_kf_dist;
        uStack_200 = (ptVar9->
                     super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>
                     ).super__Tuple_impl<1UL,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>.
                     super__Head_base<1UL,_(anonymous_namespace)::AltRefTestParams,_false>.
                     _M_head_impl.max_kf_dist;
        uStack_1fc = (ptVar9->
                     super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>
                     ).super__Tuple_impl<1UL,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>.
                     super__Head_base<1UL,_(anonymous_namespace)::AltRefTestParams,_false>.
                     _M_head_impl.min_gf_interval;
        local_1f8 = (ptVar9->
                    super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>
                    ).super__Tuple_impl<1UL,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>.
                    super__Head_base<1UL,_(anonymous_namespace)::AltRefTestParams,_false>.
                    _M_head_impl.max_gf_interval;
        uStack_1f4 = (ptVar9->
                     super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>
                     ).super__Tuple_impl<1UL,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>.
                     super__Head_base<1UL,_(anonymous_namespace)::AltRefTestParams,_false>.
                     _M_head_impl.lag_in_frames;
        TStack_1f0 = (ptVar9->
                     super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>
                     ).super__Tuple_impl<1UL,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>.
                     super__Head_base<1UL,_(anonymous_namespace)::AltRefTestParams,_false>.
                     _M_head_impl.encoding_mode;
        uStack_1ec = *(undefined4 *)
                      &(ptVar9->
                       super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>
                       ).field_0x1c;
        iVar3 = (*in_stack_fffffffffffffcc0->_vptr_TestMetaFactoryBase[2])
                          (in_stack_fffffffffffffcc0,&local_208);
        in_stack_fffffffffffffc98 = (string *)CONCAT44(extraout_var,iVar3);
        in_stack_fffffffffffffcb8 = in_stack_fffffffffffffc98;
        in_stack_fffffffffffffcd8 = in_stack_fffffffffffffc88;
        MakeAndRegisterTestInfo
                  ((char *)in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88,
                   (char *)in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78,
                   in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                   (SetUpTestSuiteFunc)CONCAT17(condition,CONCAT16(uVar2,in_stack_fffffffffffffda0))
                   ,(TearDownTestSuiteFunc)tear_down_tc,(TestFactoryBase *)factory);
        CodeLocation::~CodeLocation((CodeLocation *)0x4c14fe);
        std::__cxx11::string::~string(local_1b8);
        std::__cxx11::string::~string(local_198);
        std::__cxx11::string::~string((string *)local_130);
        Message::~Message((Message *)0x4c1532);
        ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>
        ::operator++((ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>
                      *)in_stack_fffffffffffffc90);
        local_c8 = local_c8 + 1;
      }
      ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>
      ::~ParamIterator((ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>
                        *)0x4c0e6c);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x4c15f7);
      std::__cxx11::string::~string(local_a0);
      ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>
      ::~ParamGenerator((ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>
                         *)0x4c1611);
      __gnu_cxx::
      __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo>_>_>
      ::operator++(local_38);
    }
    std::
    shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>
    ::~shared_ptr((shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>
                   *)0x4c1659);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>_>_>_>
    ::operator++(&local_18);
  }
  if ((local_9 & 1) == 0) {
    (**(code **)(*in_RDI + 0x10))();
    CodeLocation::CodeLocation(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    std::
    vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>_>_>
    ::empty((vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>_>_>
             *)in_stack_fffffffffffffca0);
    InsertSyntheticTestCase(in_stack_00000100,in_stack_000000f8,in_stack_000000f7);
    CodeLocation::~CodeLocation((CodeLocation *)0x4c16f3);
  }
  return;
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    for (typename TestInfoContainer::iterator test_it = tests_.begin();
         test_it != tests_.end(); ++test_it) {
      std::shared_ptr<TestInfo> test_info = *test_it;
      for (typename InstantiationContainer::iterator gen_it =
               instantiations_.begin();
           gen_it != instantiations_.end(); ++gen_it) {
        const std::string& instantiation_name = gen_it->name;
        ParamGenerator<ParamType> generator((*gen_it->generator)());
        ParamNameGeneratorFunc* name_func = gen_it->name_func;
        const char* file = gen_it->file;
        int line = gen_it->line;

        std::string test_suite_name;
        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        test_suite_name += test_info->test_suite_base_name;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (typename ParamGenerator<ParamType>::iterator param_it =
                 generator.begin();
             param_it != generator.end(); ++param_it, ++i) {
          generated_instantiations = true;

          Message test_name_stream;

          std::string param_name =
              name_func(TestParamInfo<ParamType>(*param_it, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid, in " << file << " line " << line << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          test_param_names.insert(param_name);

          if (!test_info->test_base_name.empty()) {
            test_name_stream << test_info->test_base_name << "/";
          }
          test_name_stream << param_name;
          MakeAndRegisterTestInfo(
              test_suite_name.c_str(), test_name_stream.GetString().c_str(),
              nullptr,  // No type parameter.
              PrintToString(*param_it).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(*param_it));
        }  // for param_it
      }    // for gen_it
    }      // for test_it

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }